

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_TestShell::
~TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_TestShell
          (TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_TestShell
           *this)

{
  TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_TestShell *this_local;
  
  ~TEST_MockExpectedCall_callOrderIsFulfilledButWithWrongOrderMultipleTooLate_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockExpectedCall, callOrderIsFulfilledButWithWrongOrderMultipleTooLate)
{
    MockCheckedExpectedCall expectedCall(3);
    expectedCall.withName("name");
    expectedCall.withCallOrder(10, 12);
    expectedCall.callWasMade(11);
    expectedCall.callWasMade(12);
    expectedCall.callWasMade(13);
    CHECK(expectedCall.isFulfilled());
    CHECK(expectedCall.isOutOfOrder());
}